

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address_impl.c
# Opt level: O0

cio_error cio_init_inet_address
                    (cio_inet_address *inet_address,uint8_t *address,size_t address_length)

{
  bool local_3a;
  size_t v6_size;
  size_t v4_size;
  size_t address_length_local;
  uint8_t *address_local;
  cio_inet_address *inet_address_local;
  
  local_3a = true;
  if ((inet_address != (cio_inet_address *)0x0) && (local_3a = true, address != (uint8_t *)0x0)) {
    local_3a = address_length != 4 && address_length != 0x10;
  }
  if (local_3a) {
    inet_address_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    if (address_length == 4) {
      (inet_address->impl).family = CIO_ADDRESS_FAMILY_INET4;
      memcpy(&(inet_address->impl).field_1,address,4);
    }
    else {
      (inet_address->impl).family = CIO_ADDRESS_FAMILY_INET6;
      memcpy(&(inet_address->impl).field_1,address,address_length);
    }
    inet_address_local._4_4_ = CIO_SUCCESS;
  }
  return inet_address_local._4_4_;
}

Assistant:

enum cio_error cio_init_inet_address(struct cio_inet_address *inet_address, const uint8_t *address, size_t address_length)
{
	size_t v4_size = sizeof(inet_address->impl.in.s_addr);
	size_t v6_size = sizeof(inet_address->impl.in6.s6_addr);
	if (cio_unlikely((inet_address == NULL) || (address == NULL) || ((address_length != v4_size) && (address_length != v6_size)))) {
		return CIO_INVALID_ARGUMENT;
	}

	if (address_length == v4_size) {
		inet_address->impl.family = CIO_ADDRESS_FAMILY_INET4;
		memcpy(&inet_address->impl.in.s_addr, address, address_length);
	} else {
		inet_address->impl.family = CIO_ADDRESS_FAMILY_INET6;
		memcpy(&inet_address->impl.in6.s6_addr, address, address_length);
	}

	return CIO_SUCCESS;
}